

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O2

void dcheck_tempv(int n,double *tempv)

{
  ulong uVar1;
  char msg [256];
  char acStack_138 [264];
  
  if (n < 1) {
    n = 0;
  }
  uVar1 = 0;
  while( true ) {
    if ((uint)n == uVar1) {
      return;
    }
    if ((tempv[uVar1] != 0.0) || (NAN(tempv[uVar1]))) break;
    uVar1 = uVar1 + 1;
  }
  fprintf(_stderr,"tempv[%d] = %f\n",uVar1 & 0xffffffff);
  sprintf(acStack_138,"%s at line %d in file %s\n","dcheck_tempv",0x15b,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dutil.c");
  superlu_abort_and_exit(acStack_138);
}

Assistant:

void dcheck_tempv(int n, double *tempv)
{
    int i;
	
    for (i = 0; i < n; i++) {
	if (tempv[i] != 0.0) 
	{
	    fprintf(stderr,"tempv[%d] = %f\n", i,tempv[i]);
	    ABORT("dcheck_tempv");
	}
    }
}